

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  byte bVar1;
  pointer pbVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  size_type sVar11;
  uint uVar12;
  string input;
  string e_2;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __rhs = pbVar2 + 2;
  __rhs_00 = pbVar2 + 3;
  replacement.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  replacement.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  replacement.
  super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar11 = 0;
LAB_003ffcc8:
  do {
    if (pbVar2[3]._M_string_length <= sVar11) break;
    uVar7 = std::__cxx11::string::find((char)__rhs_00,0x5c);
    if (uVar7 != 0xffffffffffffffff) {
      if (uVar7 != sVar11) {
        std::__cxx11::string::substr((ulong)&input,(ulong)__rhs_00);
        RegexReplacement::RegexReplacement((RegexReplacement *)&re,&input);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::emplace_back<cmStringCommand::RegexReplacement>(&replacement,(RegexReplacement *)&re);
        std::__cxx11::string::~string((string *)(re.startp + 1));
        std::__cxx11::string::~string((string *)&input);
      }
      if (uVar7 == pbVar2[3]._M_string_length - 1) {
        std::__cxx11::string::string
                  ((string *)&re,
                   "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.",
                   (allocator *)&input);
        cmCommand::SetError(&this->super_cmCommand,(string *)&re);
      }
      else {
        bVar1 = (__rhs_00->_M_dataplus)._M_p[uVar7 + 1];
        if (0x2f < (char)bVar1) {
          if (bVar1 < 0x3a) {
            re.startp[0]._0_4_ = (char)bVar1 + -0x30;
            re.startp[1] = (char *)(re.startp + 3);
            re.startp[2] = (char *)0x0;
            re.startp[3]._0_1_ = 0;
            std::
            vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
            ::emplace_back<cmStringCommand::RegexReplacement>(&replacement,(RegexReplacement *)&re);
          }
          else if (bVar1 == 0x5c) {
            RegexReplacement::RegexReplacement((RegexReplacement *)&re,"\\");
            std::
            vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
            ::emplace_back<cmStringCommand::RegexReplacement>(&replacement,(RegexReplacement *)&re);
          }
          else {
            if (bVar1 != 0x6e) goto LAB_0040004c;
            RegexReplacement::RegexReplacement((RegexReplacement *)&re,"\n");
            std::
            vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
            ::emplace_back<cmStringCommand::RegexReplacement>(&replacement,(RegexReplacement *)&re);
          }
          std::__cxx11::string::~string((string *)(re.startp + 1));
          sVar11 = uVar7 + 2;
          goto LAB_003ffcc8;
        }
LAB_0040004c:
        std::__cxx11::string::string
                  ((string *)&re,"sub-command REGEX, mode REPLACE: Unknown escape \"",
                   (allocator *)&input);
        std::__cxx11::string::substr((ulong)&input,(ulong)__rhs_00);
        std::__cxx11::string::append((string *)&re);
        std::__cxx11::string::~string((string *)&input);
        std::__cxx11::string::append((char *)&re);
        cmCommand::SetError(&this->super_cmCommand,(string *)&re);
      }
      std::__cxx11::string::~string((string *)&re);
      bVar6 = false;
      goto LAB_00400223;
    }
    sVar11 = pbVar2[3]._M_string_length;
    std::__cxx11::string::substr((ulong)&input,(ulong)__rhs_00);
    RegexReplacement::RegexReplacement((RegexReplacement *)&re,&input);
    std::
    vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>::
    emplace_back<cmStringCommand::RegexReplacement>(&replacement,(RegexReplacement *)&re);
    std::__cxx11::string::~string((string *)(re.startp + 1));
    std::__cxx11::string::~string((string *)&input);
  } while( true );
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  re.program = (char *)0x0;
  bVar6 = cmsys::RegularExpression::compile(&re,(__rhs->_M_dataplus)._M_p);
  if (bVar6) {
    e_2._M_string_length =
         (size_type)
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    e_2._M_dataplus._M_p =
         (pointer)((args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5);
    delimiter = &output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    output._M_dataplus._M_p = (pointer)delimiter;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&input,(cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&e_2,delimiter->_M_local_buf);
    std::__cxx11::string::~string((string *)&output);
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pcVar10 = (char *)0x0;
    output._M_dataplus._M_p = (pointer)delimiter;
    while( true ) {
      bVar6 = cmsys::RegularExpression::find(&re,input._M_dataplus._M_p + (long)pcVar10);
      if (!bVar6) break;
      cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
      cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&re);
      pcVar5 = re.searchstring;
      pcVar4 = re.endp[0];
      pcVar3 = (char *)CONCAT44(re.startp[0]._4_4_,(int)re.startp[0]);
      std::__cxx11::string::substr((ulong)&e_2,(ulong)&input);
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::~string((string *)&e_2);
      if (pcVar4 == pcVar3) {
        std::operator+(&local_160,"sub-command REGEX, mode REPLACE regex \"",__rhs);
        std::operator+(&e_2,&local_160,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_160);
        cmCommand::SetError(&this->super_cmCommand,&e_2);
LAB_004001f1:
        std::__cxx11::string::~string((string *)&e_2);
        goto LAB_004001ff;
      }
      uVar12 = 0;
      while( true ) {
        if ((ulong)(((long)replacement.
                           super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)replacement.
                          super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= (ulong)uVar12)
        break;
        lVar8 = (long)replacement.
                      super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar12].number;
        if (lVar8 < 0) {
          std::__cxx11::string::append((string *)&output);
        }
        else {
          uVar7 = (long)re.startp[lVar8] - (long)re.searchstring;
          if ((((uVar7 == 0xffffffffffffffff) ||
               (uVar9 = (long)re.endp[lVar8] - (long)re.searchstring, uVar9 == 0xffffffffffffffff))
              || (input._M_string_length - (long)pcVar10 < uVar7)) ||
             (input._M_string_length - (long)pcVar10 < uVar9)) {
            std::operator+(&local_70,"sub-command REGEX, mode REPLACE: replace expression \"",
                           __rhs_00);
            std::operator+(&local_50,&local_70,"\" contains an out-of-range escape for regex \"");
            std::operator+(&local_160,&local_50,__rhs);
            std::operator+(&e_2,&local_160,"\".");
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            cmCommand::SetError(&this->super_cmCommand,&e_2);
            goto LAB_004001f1;
          }
          std::__cxx11::string::substr((ulong)&e_2,(ulong)&input);
          std::__cxx11::string::append((string *)&output);
          std::__cxx11::string::~string((string *)&e_2);
        }
        uVar12 = uVar12 + 1;
      }
      pcVar10 = pcVar4 + ((long)pcVar10 - (long)pcVar5);
    }
    std::__cxx11::string::substr((ulong)&e_2,(ulong)&input);
    std::__cxx11::string::append((string *)&output);
    std::__cxx11::string::~string((string *)&e_2);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar2 + 4,output._M_dataplus._M_p);
LAB_004001ff:
    bVar6 = !bVar6;
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
  }
  else {
    std::operator+(&output,"sub-command REGEX, mode REPLACE failed to compile regex \"",__rhs);
    std::operator+(&input,&output,"\".");
    std::__cxx11::string::~string((string *)&output);
    cmCommand::SetError(&this->super_cmCommand,&input);
    std::__cxx11::string::~string((string *)&input);
    bVar6 = false;
  }
  cmsys::RegularExpression::~RegularExpression(&re);
LAB_00400223:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector(&replacement);
  return bVar6;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while (l < replace.length()) {
    std::string::size_type r = replace.find('\\', l);
    if (r == std::string::npos) {
      r = replace.length();
      replacement.push_back(replace.substr(l, r - l));
    } else {
      if (r - l > 0) {
        replacement.push_back(replace.substr(l, r - l));
      }
      if (r == (replace.length() - 1)) {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
      }
      if ((replace[r + 1] >= '0') && (replace[r + 1] <= '9')) {
        replacement.push_back(replace[r + 1] - '0');
      } else if (replace[r + 1] == 'n') {
        replacement.push_back("\n");
      } else if (replace[r + 1] == '\\') {
        replacement.push_back("\\");
      } else {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
      }
      r += 2;
    }
    l = r;
  }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while (re.find(input.c_str() + base)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::string e = "sub-command REGEX, mode REPLACE regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }

    // Concatenate the replacement for the match.
    for (unsigned int i = 0; i < replacement.size(); ++i) {
      if (replacement[i].number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
      } else {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \"" +
            replace + "\" contains an out-of-range escape for regex \"" +
            regex + "\".";
          this->SetError(e);
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}